

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

int64_t __thiscall TPZFront<std::complex<float>_>::NFree(TPZFront<std::complex<float>_> *this)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (this->fGlobal).super_TPZVec<long>.fNElements;
  lVar3 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar3;
  }
  iVar1 = 0;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    iVar1 = iVar1 + (ulong)((this->fGlobal).super_TPZVec<long>.fStore[lVar3] == -1);
  }
  return iVar1;
}

Assistant:

int64_t TPZFront<TVar>::NFree()
{
	int64_t i;
	int64_t free_eq=0;
	for(i=0;i<fGlobal.NElements();i++)
	{
		if(fGlobal[i]==-1){
			free_eq=free_eq+1;
		}
	}
	return free_eq;
}